

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XIncludeUtils.cpp
# Opt level: O0

bool xercesc_4_0::XIncludeUtils::isXIFallbackElement(XMLCh *name,XMLCh *namespaceURI)

{
  bool bVar1;
  XMLCh *namespaceURI_local;
  XMLCh *name_local;
  
  if ((namespaceURI == (XMLCh *)0x0) || (name == (XMLCh *)0x0)) {
    name_local._7_1_ = false;
  }
  else {
    bVar1 = XMLString::equals(name,(XMLCh *)fgXIFallbackQName);
    if ((bVar1) &&
       (bVar1 = XMLString::equals(namespaceURI,(XMLCh *)fgXIIIncludeNamespaceURI), bVar1)) {
      name_local._7_1_ = true;
    }
    else {
      name_local._7_1_ = false;
    }
  }
  return name_local._7_1_;
}

Assistant:

bool
XIncludeUtils::isXIFallbackElement(const XMLCh *name, const XMLCh *namespaceURI){
    if (namespaceURI == NULL || name == NULL){
        /* no namespaces not supported */
        return false;
    }
    if (XMLString::equals(name, fgXIFallbackQName)
        && XMLString::equals(namespaceURI, fgXIIIncludeNamespaceURI)){
        return true;
    }
    return false;
}